

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall Fl_Text_Display::measure_deleted_lines(Fl_Text_Display *this,int pos,int nDeleted)

{
  Fl_Text_Buffer *this_00;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int retLineEnd;
  int retPos;
  int retLineStart;
  int retLines;
  
  this_00 = this->mBuffer;
  if ((pos < this->mFirstChar) || (this->mLastChar < pos)) {
LAB_001d3cb4:
    iVar1 = Fl_Text_Buffer::line_start(this_00,pos);
  }
  else {
    uVar3 = (ulong)(uint)this->mNVisibleLines;
    do {
      if ((int)uVar3 < 2) goto LAB_001d3cb4;
      iVar1 = this->mLineStarts[uVar3 - 1];
      uVar3 = uVar3 - 1;
    } while (pos < iVar1 || iVar1 == -1);
    iVar1 = this->mLineStarts[(ulong)((int)uVar3 + 1U & 0x7fffffff) - 2];
  }
  iVar4 = 0;
  do {
    wrapped_line_counter
              (this,this_00,iVar1,this_00->mLength,1,true,0,&retPos,&retLines,&retLineStart,
               &retLineEnd,true);
    iVar1 = retPos;
    if (this_00->mLength <= retPos) {
      iVar4 = (uint)(retPos != retLineEnd) + iVar4;
LAB_001d3d43:
      this->mNLinesDeleted = iVar4;
      this->mSuppressResync = 1;
      return;
    }
    if (nDeleted + pos < retPos) {
      uVar2 = Fl_Text_Buffer::char_at(this_00,retPos + -1);
      if (uVar2 == 10) {
        iVar4 = iVar4 + 1;
        goto LAB_001d3d43;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Fl_Text_Display::measure_deleted_lines(int pos, int nDeleted) {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int retPos, retLines, retLineStart, retLineEnd;
  Fl_Text_Buffer *buf = buffer();
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int countFrom, lineStart;
  int nLines = 0, i;
  /*
   ** Determine where to begin searching: either the previous newline, or
   ** if possible, limit to the start of the (original) previous displayed
   ** line, using information from the existing line starts array
   */
  if (pos >= mFirstChar && pos <= mLastChar) {
    for (i=nVisLines-1; i>0; i--)
      if (lineStarts[i] != -1 && pos >= lineStarts[i])
        break;
    if (i > 0) {
      countFrom = lineStarts[i-1];
    } else
      countFrom = buf->line_start(pos);
  } else
    countFrom = buf->line_start(pos);

  /*
   ** Move forward through the (new) text one line at a time, counting
   ** displayed lines, and looking for either a real newline, or for the
   ** line starts to re-sync with the original line starts array
   */
  lineStart = countFrom;
  for (;;) {
    /* advance to the next line.  If the line ended in a real newline
     or the end of the buffer, that's far enough */
    wrapped_line_counter(buf, lineStart, buf->length(), 1, true, 0,
                         &retPos, &retLines, &retLineStart, &retLineEnd);
    if (retPos >= buf->length()) {
      if (retPos != retLineEnd)
        nLines++;
      break;
    } else
      lineStart = retPos;
    nLines++;
    if (lineStart > pos + nDeleted && buf->char_at(lineStart-1) == '\n') {
      break;
    }

    /* Unlike in the findWrapRange() function above, we don't try to
     resync with the line starts, because we don't know the length
     of the inserted text yet, nor the updated style information.

     Because of that, we also shouldn't resync with the line starts
     after the modification either, because we must perform the
     calculations for the deleted and inserted lines in the same way.

     This can result in some unnecessary recalculation and redrawing
     overhead, and therefore we should only use this two-phase mode
     of calculation when it's really needed (continuous wrap + variable
     font width). */
  }
  mNLinesDeleted = nLines;
  mSuppressResync = 1;
}